

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.cpp
# Opt level: O1

p_ply ply_create(char *name,e_ply_storage_mode storage_mode,p_ply_error_cb error_cb,long idata,
                void *pdata)

{
  p_ply __ptr;
  FILE *pFVar1;
  p_ply_odriver ptVar2;
  undefined1 *puVar3;
  code *pcVar4;
  undefined1 auVar5 [32];
  
  __ptr = (p_ply)calloc(1,0x20f8);
  if (__ptr == (p_ply)0x0) {
    __ptr = (p_ply)0x0;
  }
  else {
    __ptr->buffer[0] = '\0';
    auVar5 = ZEXT1632(ZEXT816(0) << 0x40);
    __ptr->element = (p_ply_element)auVar5._0_8_;
    __ptr->nelements = auVar5._8_8_;
    __ptr->comment = (char *)auVar5._16_8_;
    __ptr->ncomments = auVar5._24_8_;
    __ptr->comment = (char *)auVar5._0_8_;
    __ptr->ncomments = auVar5._8_8_;
    __ptr->obj_info = (char *)auVar5._16_8_;
    __ptr->nobj_infos = auVar5._24_8_;
    auVar5 = ZEXT1632(ZEXT816(0) << 0x40);
    __ptr->buffer_first = auVar5._0_8_;
    __ptr->buffer_token = auVar5._8_8_;
    __ptr->buffer_last = auVar5._16_8_;
    __ptr->idriver = (p_ply_idriver)auVar5._24_8_;
    __ptr->odriver = (p_ply_odriver)0x0;
    __ptr->welement = auVar5._0_8_;
    __ptr->wproperty = auVar5._8_8_;
    __ptr->winstance_index = auVar5._16_8_;
    __ptr->wvalue_index = auVar5._24_8_;
    __ptr->wlength = 0;
  }
  pcVar4 = ply_error_cb;
  if (error_cb != (p_ply_error_cb)0x0) {
    pcVar4 = error_cb;
  }
  if (__ptr == (p_ply)0x0) {
    __ptr = (p_ply)0x0;
    (*pcVar4)((p_ply)0x0,"Out of memory");
  }
  else {
    pFVar1 = fopen(name,"wb");
    if (pFVar1 == (FILE *)0x0) {
      (*pcVar4)(__ptr,"Unable to create file");
      free(__ptr);
      __ptr = (p_ply)0x0;
    }
    else {
      __ptr->idata = idata;
      __ptr->pdata = pdata;
      __ptr->io_mode = PLY_WRITE;
      if (storage_mode == PLY_DEFAULT) {
        storage_mode = PLY_LITTLE_ENDIAN;
      }
      puVar3 = (anonymous_namespace)::ply_odriver_binary_reverse;
      if (storage_mode == PLY_LITTLE_ENDIAN) {
        puVar3 = (anonymous_namespace)::ply_odriver_binary;
      }
      ptVar2 = (p_ply_odriver)(anonymous_namespace)::ply_odriver_ascii;
      if (storage_mode != PLY_ASCII) {
        ptVar2 = (p_ply_odriver)puVar3;
      }
      __ptr->odriver = ptVar2;
      __ptr->storage_mode = storage_mode;
      __ptr->fp = (FILE *)pFVar1;
      __ptr->gzfp = (gzFile)0x0;
      __ptr->error_cb = pcVar4;
    }
  }
  return __ptr;
}

Assistant:

p_ply ply_create(const char *name, e_ply_storage_mode storage_mode,
                 p_ply_error_cb error_cb, long idata, void *pdata) {
    FILE *fp = NULL;
    p_ply ply = ply_alloc();
    if (error_cb == NULL) error_cb = ply_error_cb;
    if (!ply) {
        error_cb(NULL, "Out of memory");
        return NULL;
    }
    if (!ply_type_check()) {
        error_cb(ply, "Incompatible type system");
        free(ply);
        return NULL;
    }
    assert(name && storage_mode <= PLY_DEFAULT);
    fp = fopen(name, "wb");
    if (!fp) {
        error_cb(ply, "Unable to create file");
        free(ply);
        return NULL;
    }
    ply->idata = idata;
    ply->pdata = pdata;
    ply->io_mode = PLY_WRITE;
    if (storage_mode == PLY_DEFAULT) storage_mode = ply_arch_endian();
    if (storage_mode == PLY_ASCII)
        ply->odriver = &ply_odriver_ascii;
    else if (storage_mode == ply_arch_endian())
        ply->odriver = &ply_odriver_binary;
    else
        ply->odriver = &ply_odriver_binary_reverse;
    ply->storage_mode = storage_mode;
    ply->fp = fp;
    ply->gzfp = nullptr;  // gzipped writing isn't implemented...
    ply->error_cb = error_cb;
    return ply;
}